

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

CVmTimeZone * __thiscall
CVmTimeZoneCache::parse_zone_hhmmss(CVmTimeZoneCache *this,char *prefix,char *name,size_t len)

{
  int iVar1;
  size_t len_00;
  CVmTimeZone *pCVar2;
  CVmTimeZoneCache *this_00;
  int32_t ofs;
  int32_t local_3c;
  size_t local_38;
  char *local_30;
  
  this_00 = (CVmTimeZoneCache *)prefix;
  len_00 = strlen(prefix);
  if (len_00 == 0) {
LAB_0028ca70:
    local_30 = name + len_00;
    local_38 = len - len_00;
    iVar1 = parse_hhmmss(this_00,&local_3c,&local_30,&local_38,1);
    pCVar2 = (CVmTimeZone *)0x0;
    if ((iVar1 != 0) && (local_38 == 0)) {
      pCVar2 = get_gmtofs_zone(this,local_3c);
    }
  }
  else {
    if (len_00 <= len) {
      this_00 = (CVmTimeZoneCache *)name;
      iVar1 = memicmp(name,prefix,len_00);
      if (iVar1 == 0) goto LAB_0028ca70;
    }
    pCVar2 = (CVmTimeZone *)0x0;
  }
  return pCVar2;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone_hhmmss(
    VMG_ const char *prefix, const char *name, size_t len)
{
    /* check for the prefix - if it doesn't match, return failure */
    size_t plen = strlen(prefix);
    if (plen != 0 && (len < plen || memicmp(name, prefix, plen) != 0))
        return 0;

    /* skip the prefix */
    name += plen;
    len -= plen;

    /* parse the offset */
    int32_t ofs;
    if (!parse_hhmmss(ofs, name, len, TRUE) || len != 0)
        return 0;

    /* convert the hh:mm:ss value to seconds and look up the zone */
    return get_gmtofs_zone(vmg_ ofs);
}